

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O3

int yaml_emitter_emit_flow_mapping_key(yaml_emitter_t *emitter,yaml_event_t *event,int first)

{
  yaml_emitter_state_t **ppyVar1;
  int *piVar2;
  int iVar3;
  yaml_emitter_state_t *pyVar4;
  
  if (first == 0) {
    if (event->type == YAML_MAPPING_END_EVENT) {
      iVar3 = emitter->flow_level + -1;
      goto LAB_001067c7;
    }
    iVar3 = yaml_emitter_write_indicator(emitter,",",0,0,0);
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    iVar3 = yaml_emitter_write_indicator(emitter,"{",1,1,0);
    if (iVar3 == 0) {
      return 0;
    }
    iVar3 = yaml_emitter_increase_indent(emitter,1,0);
    if (iVar3 == 0) {
      return 0;
    }
    iVar3 = emitter->flow_level;
    emitter->flow_level = iVar3 + 1;
    if (event->type == YAML_MAPPING_END_EVENT) {
LAB_001067c7:
      piVar2 = (emitter->indents).top;
      emitter->flow_level = iVar3;
      (emitter->indents).top = piVar2 + -1;
      emitter->indent = piVar2[-1];
      if ((first == 0) && (emitter->canonical != 0)) {
        iVar3 = yaml_emitter_write_indicator(emitter,",",0,0,0);
        if (iVar3 == 0) {
          return 0;
        }
        iVar3 = yaml_emitter_write_indent(emitter);
        if (iVar3 == 0) {
          return 0;
        }
      }
      iVar3 = yaml_emitter_write_indicator(emitter,"}",0,0,0);
      if (iVar3 != 0) {
        pyVar4 = (emitter->states).top;
        (emitter->states).top = pyVar4 + -1;
        emitter->state = pyVar4[-1];
        return 1;
      }
      return 0;
    }
  }
  if ((emitter->canonical == 0) && (emitter->column <= emitter->best_width)) {
LAB_001068b2:
    iVar3 = yaml_emitter_check_simple_key(emitter);
    if (iVar3 != 0) {
      pyVar4 = (emitter->states).top;
      if (pyVar4 == (emitter->states).end) {
        ppyVar1 = &(emitter->states).top;
        iVar3 = yaml_stack_extend(&(emitter->states).start,ppyVar1,&(emitter->states).end);
        if (iVar3 == 0) {
          emitter->error = YAML_MEMORY_ERROR;
          return 0;
        }
        pyVar4 = *ppyVar1;
      }
      (emitter->states).top = pyVar4 + 1;
      *pyVar4 = YAML_EMIT_FLOW_MAPPING_SIMPLE_VALUE_STATE;
      iVar3 = 1;
      goto LAB_00106996;
    }
  }
  else {
    iVar3 = yaml_emitter_write_indent(emitter);
    if (iVar3 == 0) {
      return 0;
    }
    if (emitter->canonical == 0) goto LAB_001068b2;
  }
  iVar3 = yaml_emitter_write_indicator(emitter,"?",1,0,0);
  if (iVar3 == 0) {
    return 0;
  }
  pyVar4 = (emitter->states).top;
  if (pyVar4 == (emitter->states).end) {
    ppyVar1 = &(emitter->states).top;
    iVar3 = yaml_stack_extend(&(emitter->states).start,ppyVar1,&(emitter->states).end);
    if (iVar3 == 0) {
      emitter->error = YAML_MEMORY_ERROR;
      return 0;
    }
    pyVar4 = *ppyVar1;
  }
  (emitter->states).top = pyVar4 + 1;
  *pyVar4 = YAML_EMIT_FLOW_MAPPING_VALUE_STATE;
  iVar3 = 0;
LAB_00106996:
  iVar3 = yaml_emitter_emit_node(emitter,event,0,0,1,iVar3);
  return iVar3;
}

Assistant:

static int
yaml_emitter_emit_flow_mapping_key(yaml_emitter_t *emitter,
        yaml_event_t *event, int first)
{
    if (first)
    {
        if (!yaml_emitter_write_indicator(emitter, "{", 1, 1, 0))
            return 0;
        if (!yaml_emitter_increase_indent(emitter, 1, 0))
            return 0;
        emitter->flow_level ++;
    }

    if (event->type == YAML_MAPPING_END_EVENT)
    {
        emitter->flow_level --;
        emitter->indent = POP(emitter, emitter->indents);
        if (emitter->canonical && !first) {
            if (!yaml_emitter_write_indicator(emitter, ",", 0, 0, 0))
                return 0;
            if (!yaml_emitter_write_indent(emitter))
                return 0;
        }
        if (!yaml_emitter_write_indicator(emitter, "}", 0, 0, 0))
            return 0;
        emitter->state = POP(emitter, emitter->states);

        return 1;
    }

    if (!first) {
        if (!yaml_emitter_write_indicator(emitter, ",", 0, 0, 0))
            return 0;
    }
    if (emitter->canonical || emitter->column > emitter->best_width) {
        if (!yaml_emitter_write_indent(emitter))
            return 0;
    }

    if (!emitter->canonical && yaml_emitter_check_simple_key(emitter))
    {
        if (!PUSH(emitter, emitter->states,
                    YAML_EMIT_FLOW_MAPPING_SIMPLE_VALUE_STATE))
            return 0;

        return yaml_emitter_emit_node(emitter, event, 0, 0, 1, 1);
    }
    else
    {
        if (!yaml_emitter_write_indicator(emitter, "?", 1, 0, 0))
            return 0;
        if (!PUSH(emitter, emitter->states,
                    YAML_EMIT_FLOW_MAPPING_VALUE_STATE))
            return 0;

        return yaml_emitter_emit_node(emitter, event, 0, 0, 1, 0);
    }
}